

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::A_formatter<spdlog::details::scoped_padder>::format
          (A_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  scoped_padder *in_RDI;
  scoped_padder p;
  string_view_t field_value;
  size_type in_stack_ffffffffffffff78;
  basic_string_view<char> *this_00;
  memory_buf_t *in_stack_ffffffffffffff88;
  memory_buf_t *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  scoped_padder *in_stack_ffffffffffffffa0;
  basic_string_view<char> local_30 [3];
  
  std::array<const_char_*,_7UL>::operator[]
            ((array<const_char_*,_7UL> *)in_RDI,in_stack_ffffffffffffff78);
  this_00 = local_30;
  fmt::v11::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_ffffffffffffff88,(char *)in_RDI);
  fmt::v11::basic_string_view<char>::size(this_00);
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (padding_info *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  view.size_ = local_30[0].size_;
  view.data_ = local_30[0].data_;
  fmt_helper::append_string_view(view,in_stack_ffffffffffffff90);
  scoped_padder::~scoped_padder(in_RDI);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        string_view_t field_value{full_days[static_cast<size_t>(tm_time.tm_wday)]};
        ScopedPadder p(field_value.size(), padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }